

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::parseBranchDirective
          (Preprocessor *this,Token directive,ConditionalDirectiveExpressionSyntax *expr,bool taken)

{
  byte bVar1;
  SyntaxKind SVar2;
  ConditionalBranchDirectiveSyntax *syntax_00;
  BumpAllocator *in_RCX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  long in_RDI;
  byte in_R8B;
  SyntaxNode *syntax;
  bool done;
  Token token;
  Preprocessor *in_stack_00000130;
  Token *in_stack_ffffffffffffff48;
  SmallVectorBase<slang::parsing::Token> *in_stack_ffffffffffffff50;
  span<slang::parsing::Token,_18446744073709551615UL> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  Token in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  Trivia local_10;
  
  bVar1 = in_R8B & 1;
  SmallVectorBase<slang::parsing::Token>::clear(in_stack_ffffffffffffff50);
  if ((bVar1 & 1) == 0) {
    while( true ) {
      in_stack_ffffffffffffffb8 = nextRaw(in_stack_00000130);
      in_stack_ffffffffffffffb7 = 0;
      if (in_stack_ffffffffffffffb8.kind == EndOfFile) {
        in_stack_ffffffffffffffb7 = 1;
      }
      else if ((in_stack_ffffffffffffffb8.kind == Directive) &&
              ((((SVar2 = Token::directiveKind((Token *)in_stack_ffffffffffffff50),
                 SVar2 == ElsIfDirective || (SVar2 == ElseDirective)) || (SVar2 == EndIfDirective))
               || ((SVar2 == IfDefDirective || (SVar2 == IfNDefDirective)))))) {
        in_stack_ffffffffffffffb7 = 1;
      }
      if ((in_stack_ffffffffffffffb7 & 1) != 0) break;
      SmallVectorBase<slang::parsing::Token>::push_back
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    *(long *)(in_RDI + 0x1d8) = in_stack_ffffffffffffffb8._0_8_;
    *(Info **)(in_RDI + 0x1e0) = in_stack_ffffffffffffffb8.info;
  }
  if (in_RCX == (BumpAllocator *)0x0) {
    Token::directiveKind(*(Token **)(in_RDI + 8));
    SmallVectorBase<slang::parsing::Token>::copy
              ((SmallVectorBase<slang::parsing::Token> *)(in_RDI + 0x200),
               *(EVP_PKEY_CTX **)(in_RDI + 8),src_00);
    syntax_00 = (ConditionalBranchDirectiveSyntax *)
                BumpAllocator::
                emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,std::span<slang::parsing::Token,18446744073709551615ul>>
                          ((BumpAllocator *)in_stack_ffffffffffffffb8.info,
                           in_stack_ffffffffffffffb8._0_8_,
                           (Token *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8);
  }
  else {
    Token::directiveKind((Token *)in_stack_ffffffffffffff50);
    SmallVectorBase<slang::parsing::Token>::copy
              ((SmallVectorBase<slang::parsing::Token> *)(in_RDI + 0x200),
               *(EVP_PKEY_CTX **)(in_RDI + 8),src);
    syntax_00 = BumpAllocator::
                emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,std::span<slang::parsing::Token,18446744073709551615ul>>
                          (in_RCX,(SyntaxKind *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),
                           (Token *)in_stack_ffffffffffffffb8.info,in_stack_ffffffffffffffb8._0_8_,
                           (span<slang::parsing::Token,_18446744073709551615UL> *)
                           CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  Trivia::Trivia(&local_10,Directive,(SyntaxNode *)syntax_00);
  return local_10;
}

Assistant:

Trivia Preprocessor::parseBranchDirective(Token directive,
                                          syntax::ConditionalDirectiveExpressionSyntax* expr,
                                          bool taken) {
    scratchTokenBuffer.clear();
    if (!taken) {
        // skip over everything until we find another conditional compilation directive
        while (true) {
            auto token = nextRaw();

            // EoF or conditional directive stops the skipping process
            bool done = false;
            if (token.kind == TokenKind::EndOfFile) {
                done = true;
            }
            else if (token.kind == TokenKind::Directive) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        done = true;
                        break;
                    default:
                        break;
                }
            }

            if (done) {
                // put the token back so that we'll look at it next
                currentToken = token;
                break;
            }
            scratchTokenBuffer.push_back(token);
        }
    }

    SyntaxNode* syntax;
    if (expr) {
        syntax = alloc.emplace<ConditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                 directive, *expr,
                                                                 scratchTokenBuffer.copy(alloc));
    }
    else {
        syntax = alloc.emplace<UnconditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                   directive,
                                                                   scratchTokenBuffer.copy(alloc));
    }
    return Trivia(TriviaKind::Directive, syntax);
}